

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O2

void google::protobuf::internal::DynamicMapField::ClearMapNoSyncImpl(MapFieldBase *base)

{
  Arena *pAVar1;
  iterator __begin3;
  UntypedMapIterator local_28;
  
  pAVar1 = MapFieldBase::arena(base);
  if (pAVar1 == (Arena *)0x0) {
    UntypedMapBase::begin(&local_28,(UntypedMapBase *)(base + 1));
    while (local_28.node_ != (NodeBase *)0x0) {
      MapValueRef::DeleteData((MapValueRef *)(local_28.node_ + 6));
      UntypedMapIterator::PlusPlus(&local_28);
    }
  }
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::clear
            ((Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *)(base + 1));
  return;
}

Assistant:

void DynamicMapField::ClearMapNoSyncImpl(MapFieldBase& base) {
  auto& self = static_cast<DynamicMapField&>(base);
  if (self.arena() == nullptr) {
    for (auto& elem : self.map_) {
      elem.second.DeleteData();
    }
  }

  self.map_.clear();
}